

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aesgcmsiv.cc
# Opt level: O2

void anon_unknown.dwarf_ac4e9c::crypto_polyval_update_blocks
               (polyval_ctx *ctx,uint8_t *in,size_t in_len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __n;
  uint8_t buf [512];
  ulong local_230 [64];
  
  if ((in_len & 0xf) == 0) {
    for (; in_len != 0; in_len = in_len - __n) {
      __n = 0x200;
      if (in_len < 0x200) {
        __n = in_len;
      }
      memcpy(local_230,in,__n);
      in = in + __n;
      for (uVar3 = 0; ((uint)__n & 0x3f0) != uVar3; uVar3 = uVar3 + 0x10) {
        uVar1 = *(ulong *)((long)local_230 + uVar3);
        uVar2 = *(ulong *)((long)local_230 + uVar3 + 8);
        *(ulong *)((long)local_230 + uVar3) =
             uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
             (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
             (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
        *(ulong *)((long)local_230 + uVar3 + 8) =
             uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      }
      (*ctx->ghash)(ctx->S,ctx->Htable,(uint8_t *)local_230,__n);
    }
    return;
  }
  __assert_fail("(in_len & 15) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aesgcmsiv.cc"
                ,0x29f,
                "void (anonymous namespace)::crypto_polyval_update_blocks(struct polyval_ctx *, const uint8_t *, size_t)"
               );
}

Assistant:

void crypto_polyval_update_blocks(struct polyval_ctx *ctx, const uint8_t *in,
                                  size_t in_len) {
  assert((in_len & 15) == 0);
  alignas(8) uint8_t buf[32 * 16];

  while (in_len > 0) {
    size_t todo = in_len;
    if (todo > sizeof(buf)) {
      todo = sizeof(buf);
    }
    OPENSSL_memcpy(buf, in, todo);
    in += todo;
    in_len -= todo;

    size_t blocks = todo / 16;
    for (size_t i = 0; i < blocks; i++) {
      byte_reverse(buf + 16 * i);
    }

    ctx->ghash(ctx->S, ctx->Htable, buf, todo);
  }
}